

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha0_ia32aes_a.h
# Opt level: O0

uint64_t t1ha0_ia32aes_noavx(void *data,size_t len,uint64_t seed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  sbyte sVar17;
  ulong in_RDX;
  ulong in_RSI;
  undefined1 (*in_RDI) [16];
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  long lVar21;
  undefined1 auVar22 [16];
  __m128i v0y7_1;
  __m128i v45_67;
  __m128i v2x6;
  __m128i v0y;
  __m128i v7;
  __m128i v6;
  __m128i v5;
  __m128i v4;
  __m128i v3;
  __m128i v2;
  __m128i v1;
  __m128i v0;
  __m128i *detent;
  __m128i *v_1;
  __m128i y;
  __m128i x;
  uint64_t b;
  uint64_t a;
  uint64_t h_3;
  uint64_t h_2;
  uint64_t h_1;
  uint64_t h;
  uint shift;
  uint offset;
  uint8_t *p;
  uint64_t y_1;
  uint64_t x_1;
  __uint128_t r;
  __uint128_t r_1;
  __uint128_t r_2;
  __uint128_t r_3;
  uint64_t h_4;
  uint64_t l;
  __uint128_t r_4;
  undefined1 (*local_870) [16];
  ulong local_7f8;
  ulong uStack_7f0;
  long local_7c8;
  long lStack_7c0;
  undefined1 (*local_730) [16];
  undefined1 local_728 [16];
  undefined1 local_718 [16];
  ulong local_700;
  ulong local_6f8;
  ulong local_6e8;
  undefined1 (*local_6e0) [16];
  ulong local_4e8;
  ulong uStack_4e0;
  long local_4a8;
  long lStack_4a0;
  ulong local_160;
  ulong local_128;
  long local_120;
  ulong local_f8;
  long local_f0;
  ulong local_c8;
  long local_c0;
  ulong local_98;
  long local_90;
  uint64_t *v;
  __m128i v1x_1;
  __m128i v0y_2;
  __m128i v3x;
  __m128i v2y;
  __m128i v1x;
  __m128i v0y_1;
  __m128i v2x6_3;
  
  local_700 = in_RSI;
  local_6f8 = in_RDX;
  local_6e8 = in_RSI;
  local_6e0 = in_RDI;
  if (0x20 < in_RSI) {
    local_718._8_8_ = in_RDX;
    local_718._0_8_ = in_RSI;
    auVar20._8_8_ = in_RDX;
    auVar20._0_8_ = in_RSI;
    auVar19._8_8_ = 0xc060724a8424f345;
    auVar19._0_8_ = 0xcb5af53ae3aaac31;
    local_728 = aesenc(auVar20,auVar19);
    local_730 = in_RDI;
    while( true ) {
      if ((undefined1 (*) [16])(in_RDI[-8] + in_RSI + 1) <= local_730) break;
      auVar19 = aesenc(*local_730,local_728);
      auVar8._8_8_ = local_718._8_8_ ^ *(ulong *)(local_730[6] + 8);
      auVar8._0_8_ = local_718._0_8_ ^ *(ulong *)local_730[6];
      auVar20 = aesenc(local_730[2],auVar8);
      auVar22 = aesenc(local_730[4],local_730[5]);
      local_4e8 = auVar22._0_8_;
      uStack_4e0 = auVar22._8_8_;
      local_7c8 = auVar19._0_8_;
      lStack_7c0 = auVar19._8_8_;
      auVar15._8_8_ = *(long *)(local_730[7] + 8) - lStack_7c0;
      auVar15._0_8_ = *(long *)local_730[7] - local_7c8;
      auVar19 = aesdec(auVar15,local_730[1]);
      auVar20 = aesenc(auVar20,local_730[3]);
      auVar7._8_8_ = uStack_4e0 ^ *(ulong *)(local_730[6] + 8) + *(long *)(local_730[7] + 8);
      auVar7._0_8_ = local_4e8 ^ *(ulong *)local_730[6] + *(long *)local_730[7];
      auVar6._8_8_ = local_718._8_8_ + local_728._8_8_;
      auVar6._0_8_ = local_718._0_8_ + local_728._0_8_;
      local_718 = aesenc(auVar7,auVar6);
      local_7f8 = auVar19._0_8_;
      uStack_7f0 = auVar19._8_8_;
      auVar22._8_8_ = uStack_7f0 ^ *(ulong *)(local_730[5] + 8);
      auVar22._0_8_ = local_7f8 ^ *(ulong *)local_730[5];
      local_728 = aesenc(auVar20,auVar22);
      local_730 = local_730 + 8;
    }
    if ((in_RSI & 0x40) != 0) {
      auVar14._8_8_ = local_728._8_8_ + *(long *)(*local_730 + 8);
      auVar14._0_8_ = local_728._0_8_ + *(long *)*local_730;
      auVar19 = aesdec(local_718,auVar14);
      auVar13._8_8_ = local_718._8_8_ - *(long *)(local_730[1] + 8);
      auVar13._0_8_ = local_718._0_8_ - *(long *)local_730[1];
      auVar20 = aesdec(local_728,auVar13);
      local_728._0_8_ = auVar20._0_8_;
      local_728._8_8_ = auVar20._8_8_;
      local_718._0_8_ = auVar19._0_8_;
      local_718._8_8_ = auVar19._8_8_;
      lVar18 = local_718._0_8_ - *(long *)local_730[3];
      lVar21 = local_718._8_8_ - *(long *)(local_730[3] + 8);
      auVar12._8_8_ = local_728._8_8_ + *(long *)(local_730[2] + 8);
      auVar12._0_8_ = local_728._0_8_ + *(long *)local_730[2];
      local_718 = aesdec(auVar19,auVar12);
      auVar11._8_8_ = lVar21;
      auVar11._0_8_ = lVar18;
      local_728 = aesdec(auVar20,auVar11);
      local_730 = local_730 + 4;
    }
    if ((in_RSI & 0x20) != 0) {
      lVar18 = local_718._0_8_ - *(long *)local_730[1];
      lVar21 = local_718._8_8_ - *(long *)(local_730[1] + 8);
      auVar10._8_8_ = local_728._8_8_ + *(long *)(*local_730 + 8);
      auVar10._0_8_ = local_728._0_8_ + *(long *)*local_730;
      local_718 = aesdec(local_718,auVar10);
      auVar9._8_8_ = lVar21;
      auVar9._0_8_ = lVar18;
      local_728 = aesdec(local_728,auVar9);
      local_730 = local_730 + 2;
    }
    if ((in_RSI & 0x10) != 0) {
      local_728._8_8_ = local_718._8_8_ + local_728._8_8_;
      local_728._0_8_ = local_718._0_8_ + local_728._0_8_;
      local_718 = aesdec(local_718,*local_730);
      local_730 = local_730 + 1;
    }
    auVar19 = aesenc(local_728,local_718);
    auVar19 = aesdec(local_718,auVar19);
    local_4a8 = auVar19._0_8_;
    lStack_4a0 = auVar19._8_8_;
    local_6f8 = local_4a8 + local_728._0_8_;
    local_700 = lStack_4a0 + local_728._8_8_;
    local_6e0 = local_730;
    local_6e8 = in_RSI & 0xf;
  }
  local_870 = local_6e0;
  switch(local_6e8) {
  default:
    local_870 = (undefined1 (*) [16])(*local_6e0 + 8);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_700 + *(long *)*local_6e0;
    local_120 = SUB168(auVar1 * ZEXT816(0x9c06faf4d023e3ab),8);
    local_128 = SUB168(auVar1 * ZEXT816(0x9c06faf4d023e3ab),0);
    local_6f8 = local_128 ^ local_6f8;
    local_700 = local_120 + local_700;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_6f8 + *(long *)*local_870;
    local_f0 = SUB168(auVar2 * ZEXT816(0xbd9cacc22c6e9571),8);
    local_f8 = SUB168(auVar2 * ZEXT816(0xbd9cacc22c6e9571),0);
    local_700 = local_f8 ^ local_700;
    local_6f8 = local_f0 + local_6f8;
    local_870 = (undefined1 (*) [16])(*local_870 + 8);
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_700 + *(long *)*local_870;
    local_c0 = SUB168(auVar3 * ZEXT816(0xd4f06db99d67be4b),8);
    local_c8 = SUB168(auVar3 * ZEXT816(0xd4f06db99d67be4b),0);
    local_6f8 = local_c8 ^ local_6f8;
    local_700 = local_c0 + local_700;
    local_870 = (undefined1 (*) [16])(*local_870 + 8);
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    uVar16 = 8U - (int)local_6e8 & 7;
    sVar17 = (sbyte)(uVar16 << 3);
    if (((ulong)local_870 & 0xff8) == 0) {
      local_160 = *(ulong *)*local_870 & 0xffffffffffffffffU >> sVar17;
    }
    else {
      local_160 = *(ulong *)((long)local_870 - (ulong)uVar16) >> sVar17;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_6f8 + local_160;
    local_90 = SUB168(auVar4 * ZEXT816(0x82434fe90edcef39),8);
    local_98 = SUB168(auVar4 * ZEXT816(0x82434fe90edcef39),0);
    local_700 = local_98 ^ local_700;
    local_6f8 = local_90 + local_6f8;
  case 0:
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (local_6f8 + (local_700 >> 0x29 | local_700 << 0x17)) * -0x136640f27c8d3555 ^
                   ((local_6f8 >> 0x17 | local_6f8 << 0x29) + local_700) * -0x34a50ac51c5553cf;
    v0y_1[0] = SUB168(auVar5 * ZEXT816(0xc060724a8424f345),8);
    v1x[1] = SUB168(auVar5 * ZEXT816(0xc060724a8424f345),0);
    return v1x[1] ^ v0y_1[0];
  }
}

Assistant:

uint64_t T1HA_IA32AES_NAME(const void *data, size_t len, uint64_t seed) {
  uint64_t a = seed;
  uint64_t b = len;

  if (unlikely(len > 32)) {
    __m128i x = _mm_set_epi64x(a, b);
    __m128i y = _mm_aesenc_si128(x, _mm_set_epi64x(prime_5, prime_6));

    const __m128i *__restrict v = (const __m128i *)data;
    const __m128i *__restrict const detent =
        (const __m128i *)((const uint8_t *)data + len - 127);

    while (v < detent) {
      __m128i v0 = _mm_loadu_si128(v + 0);
      __m128i v1 = _mm_loadu_si128(v + 1);
      __m128i v2 = _mm_loadu_si128(v + 2);
      __m128i v3 = _mm_loadu_si128(v + 3);
      __m128i v4 = _mm_loadu_si128(v + 4);
      __m128i v5 = _mm_loadu_si128(v + 5);
      __m128i v6 = _mm_loadu_si128(v + 6);
      __m128i v7 = _mm_loadu_si128(v + 7);

      __m128i v0y = _mm_aesenc_si128(v0, y);
      __m128i v2x6 = _mm_aesenc_si128(v2, _mm_xor_si128(x, v6));
      __m128i v45_67 =
          _mm_xor_si128(_mm_aesenc_si128(v4, v5), _mm_add_epi64(v6, v7));

      __m128i v0y7_1 = _mm_aesdec_si128(_mm_sub_epi64(v7, v0y), v1);
      __m128i v2x6_3 = _mm_aesenc_si128(v2x6, v3);

      x = _mm_aesenc_si128(v45_67, _mm_add_epi64(x, y));
      y = _mm_aesenc_si128(v2x6_3, _mm_xor_si128(v0y7_1, v5));
      v += 8;
    }

    if (len & 64) {
      __m128i v0y = _mm_add_epi64(y, _mm_loadu_si128(v++));
      __m128i v1x = _mm_sub_epi64(x, _mm_loadu_si128(v++));
      x = _mm_aesdec_si128(x, v0y);
      y = _mm_aesdec_si128(y, v1x);

      __m128i v2y = _mm_add_epi64(y, _mm_loadu_si128(v++));
      __m128i v3x = _mm_sub_epi64(x, _mm_loadu_si128(v++));
      x = _mm_aesdec_si128(x, v2y);
      y = _mm_aesdec_si128(y, v3x);
    }

    if (len & 32) {
      __m128i v0y = _mm_add_epi64(y, _mm_loadu_si128(v++));
      __m128i v1x = _mm_sub_epi64(x, _mm_loadu_si128(v++));
      x = _mm_aesdec_si128(x, v0y);
      y = _mm_aesdec_si128(y, v1x);
    }

    if (len & 16) {
      y = _mm_add_epi64(x, y);
      x = _mm_aesdec_si128(x, _mm_loadu_si128(v++));
    }

    x = _mm_add_epi64(_mm_aesdec_si128(x, _mm_aesenc_si128(y, x)), y);
#if defined(__x86_64__) || defined(_M_X64)
#if defined(__SSE4_1__) || defined(__AVX__)
    a = _mm_extract_epi64(x, 0);
    b = _mm_extract_epi64(x, 1);
#else
    a = _mm_cvtsi128_si64(x);
    b = _mm_cvtsi128_si64(_mm_unpackhi_epi64(x, x));
#endif
#else
#if defined(__SSE4_1__) || defined(__AVX__)
    a = (uint32_t)_mm_extract_epi32(x, 0) | (uint64_t)_mm_extract_epi32(x, 1)
                                                << 32;
    b = (uint32_t)_mm_extract_epi32(x, 2) | (uint64_t)_mm_extract_epi32(x, 3)
                                                << 32;
#else
    a = (uint32_t)_mm_cvtsi128_si32(x);
    a |= (uint64_t)_mm_cvtsi128_si32(_mm_shuffle_epi32(x, 1)) << 32;
    x = _mm_unpackhi_epi64(x, x);
    b = (uint32_t)_mm_cvtsi128_si32(x);
    b |= (uint64_t)_mm_cvtsi128_si32(_mm_shuffle_epi32(x, 1)) << 32;
#endif
#endif
#ifdef __AVX__
    _mm256_zeroall();
#elif !(defined(_X86_64_) || defined(__x86_64__) || defined(_M_X64))
    _mm_empty();
#endif
    data = v;
    len &= 15;
  }

  const uint64_t *v = (const uint64_t *)data;
  switch (len) {
  default:
    mixup64(&a, &b, fetch64_le_unaligned(v++), prime_4);
  /* fall through */
  case 24:
  case 23:
  case 22:
  case 21:
  case 20:
  case 19:
  case 18:
  case 17:
    mixup64(&b, &a, fetch64_le_unaligned(v++), prime_3);
  /* fall through */
  case 16:
  case 15:
  case 14:
  case 13:
  case 12:
  case 11:
  case 10:
  case 9:
    mixup64(&a, &b, fetch64_le_unaligned(v++), prime_2);
  /* fall through */
  case 8:
  case 7:
  case 6:
  case 5:
  case 4:
  case 3:
  case 2:
  case 1:
    mixup64(&b, &a, tail64_le_unaligned(v, len), prime_1);
  /* fall through */
  case 0:
    return final64(a, b);
  }
}